

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AppendPositionIndependentLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  char *pcVar5;
  long *plVar6;
  cmValue cVar7;
  string *psVar8;
  long *plVar9;
  size_type *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  _Alloc_hider _Var11;
  string_view arg;
  string_view value;
  string pieFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagsList;
  string name;
  string mode;
  string supported;
  long *local_d0;
  size_t local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == EXECUTABLE) {
    pcVar5 = cmGeneratorTarget::GetLinkPIEProperty(target,config);
    if (pcVar5 != (char *)0x0) {
      bVar3 = cmValue::IsOn(pcVar5);
      pcVar5 = "NO_PIE";
      if (bVar3) {
        pcVar5 = "PIE";
      }
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,pcVar5,pcVar5 + (ulong)!bVar3 * 3 + 3);
      std::operator+(&local_b0,"CMAKE_",lang);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_c0 = *plVar9;
        lStack_b8 = plVar6[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar9;
        local_d0 = (long *)*plVar6;
      }
      local_c8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70[0]);
      paVar1 = &local_90.field_2;
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90.field_2._8_8_ = plVar6[3];
        local_90._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_90._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_50.field_2._M_allocated_capacity = *psVar10;
        local_50.field_2._8_8_ = plVar6[3];
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar10;
        local_50._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_50._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cVar7 = cmMakefile::GetDefinition(this->Makefile,&local_50);
      if (cVar7.Value != (string *)0x0) {
        value._M_str = ((cVar7.Value)->_M_dataplus)._M_p;
        value._M_len = (cVar7.Value)->_M_string_length;
        bVar3 = cmValue::IsOff(value);
        if (!bVar3) {
          std::operator+(&local_b0,"CMAKE_",lang);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_c0 = *plVar9;
            lStack_b8 = plVar6[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar9;
            local_d0 = (long *)*plVar6;
          }
          local_c8 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70[0]);
          psVar10 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_90.field_2._M_allocated_capacity = *psVar10;
            local_90.field_2._8_8_ = plVar6[3];
            local_90._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar10;
            local_90._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_90._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          psVar8 = cmMakefile::GetSafeDefinition(this->Makefile,&local_90);
          pcVar2 = (psVar8->_M_dataplus)._M_p;
          local_d0 = &local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,pcVar2 + psVar8->_M_string_length);
          if (local_c8 != 0) {
            arg._M_str = (char *)local_d0;
            arg._M_len = local_c8;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_b0,arg,false);
            for (_Var11._M_p = local_b0._M_dataplus._M_p;
                _Var11._M_p != (pointer)local_b0._M_string_length; _Var11._M_p = _Var11._M_p + 0x20)
            {
              (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var11._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_b0);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendPositionIndependentLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  // For now, only EXECUTABLE is concerned
  if (target->GetType() != cmStateEnums::EXECUTABLE) {
    return;
  }

  const char* PICValue = target->GetLinkPIEProperty(config);
  if (PICValue == nullptr) {
    // POSITION_INDEPENDENT_CODE is not set
    return;
  }

  const std::string mode = cmIsOn(PICValue) ? "PIE" : "NO_PIE";

  std::string supported = "CMAKE_" + lang + "_LINK_" + mode + "_SUPPORTED";
  if (cmIsOff(this->Makefile->GetDefinition(supported))) {
    return;
  }

  std::string name = "CMAKE_" + lang + "_LINK_OPTIONS_" + mode;

  auto pieFlags = this->Makefile->GetSafeDefinition(name);
  if (pieFlags.empty()) {
    return;
  }

  std::vector<std::string> flagsList = cmExpandedList(pieFlags);
  for (const auto& flag : flagsList) {
    this->AppendFlagEscape(flags, flag);
  }
}